

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O3

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_arc
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,double x,double y,double dx1,double dy1,
          double dx2,double dy2)

{
  double *pdVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  uint uVar7;
  point_base<double> **pppVar8;
  int iVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_a0;
  double dStack_50;
  
  local_a0 = atan2((double)this->m_width_sign * dy1,(double)this->m_width_sign * dx1);
  dVar11 = atan2((double)this->m_width_sign * dy2,(double)this->m_width_sign * dx2);
  dVar12 = acos(this->m_width_abs / (0.125 / this->m_approx_scale + this->m_width_abs));
  auVar3._8_4_ = SUB84(y,0);
  auVar3._0_8_ = x;
  auVar3._12_4_ = (int)((ulong)y >> 0x20);
  uVar7 = vc->m_size;
  uVar10 = uVar7 >> 6;
  if (vc->m_num_blocks <= uVar10) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar10);
    uVar7 = vc->m_size;
  }
  pppVar8 = vc->m_blocks;
  pdVar1 = (double *)((long)&pppVar8[uVar10]->x + (ulong)((uVar7 & 0x3f) << 4));
  *pdVar1 = dx1 + x;
  pdVar1[1] = dy1 + y;
  uVar7 = uVar7 + 1;
  vc->m_size = uVar7;
  dStack_50 = auVar3._8_8_;
  if (this->m_width_sign < 1) {
    dVar11 = local_a0 -
             (double)(~-(ulong)(local_a0 < dVar11) & (ulong)dVar11 |
                     (ulong)(dVar11 + -6.283185307179586) & -(ulong)(local_a0 < dVar11));
    iVar9 = (int)(dVar11 / (dVar12 + dVar12));
    if (0 < iVar9) {
      iVar2 = iVar9 + 1;
      do {
        local_a0 = local_a0 - dVar11 / (double)iVar2;
        dVar13 = cos(local_a0);
        dVar6 = this->m_width;
        dVar14 = sin(local_a0);
        dVar12 = this->m_width;
        uVar7 = vc->m_size;
        uVar10 = uVar7 >> 6;
        if (vc->m_num_blocks <= uVar10) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar10);
          uVar7 = vc->m_size;
        }
        dVar12 = dVar14 * dVar12 + dStack_50;
        pppVar8 = vc->m_blocks;
        auVar5._8_4_ = SUB84(dVar12,0);
        auVar5._0_8_ = dVar13 * dVar6 + x;
        auVar5._12_4_ = (int)((ulong)dVar12 >> 0x20);
        *(undefined1 (*) [16])((long)&pppVar8[uVar10]->x + (ulong)((uVar7 & 0x3f) << 4)) = auVar5;
        uVar7 = uVar7 + 1;
        vc->m_size = uVar7;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  else {
    dVar11 = (double)(~-(ulong)(dVar11 < local_a0) & (ulong)dVar11 |
                     (ulong)(dVar11 + 6.283185307179586) & -(ulong)(dVar11 < local_a0)) - local_a0;
    iVar9 = (int)(dVar11 / (dVar12 + dVar12));
    if (0 < iVar9) {
      iVar2 = iVar9 + 1;
      do {
        local_a0 = local_a0 + dVar11 / (double)iVar2;
        dVar13 = cos(local_a0);
        dVar6 = this->m_width;
        dVar14 = sin(local_a0);
        dVar12 = this->m_width;
        uVar7 = vc->m_size;
        uVar10 = uVar7 >> 6;
        if (vc->m_num_blocks <= uVar10) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar10);
          uVar7 = vc->m_size;
        }
        dVar12 = dVar14 * dVar12 + dStack_50;
        pppVar8 = vc->m_blocks;
        auVar4._8_4_ = SUB84(dVar12,0);
        auVar4._0_8_ = dVar13 * dVar6 + x;
        auVar4._12_4_ = (int)((ulong)dVar12 >> 0x20);
        *(undefined1 (*) [16])((long)&pppVar8[uVar10]->x + (ulong)((uVar7 & 0x3f) << 4)) = auVar4;
        uVar7 = uVar7 + 1;
        vc->m_size = uVar7;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  uVar10 = uVar7 >> 6;
  if (vc->m_num_blocks <= uVar10) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar10);
    uVar7 = vc->m_size;
    pppVar8 = vc->m_blocks;
  }
  pdVar1 = (double *)((long)&pppVar8[uVar10]->x + (ulong)((uVar7 & 0x3f) << 4));
  *pdVar1 = x + dx2;
  pdVar1[1] = dStack_50 + dy2;
  vc->m_size = uVar7 + 1;
  return;
}

Assistant:

void math_stroke<VC>::calc_arc(VC& vc,
                                   double x,   double y, 
                                   double dx1, double dy1, 
                                   double dx2, double dy2)
    {
        double a1 = atan2(dy1 * m_width_sign, dx1 * m_width_sign);
        double a2 = atan2(dy2 * m_width_sign, dx2 * m_width_sign);
        double da = a1 - a2;
        int i, n;

        da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;

        add_vertex(vc, x + dx1, y + dy1);
        if(m_width_sign > 0)
        {
            if(a1 > a2) a2 += 2 * pi;
            n = int((a2 - a1) / da);
            da = (a2 - a1) / (n + 1);
            a1 += da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 += da;
            }
        }
        else
        {
            if(a1 < a2) a2 -= 2 * pi;
            n = int((a1 - a2) / da);
            da = (a1 - a2) / (n + 1);
            a1 -= da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 -= da;
            }
        }
        add_vertex(vc, x + dx2, y + dy2);
    }